

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  FT_Bool FVar1;
  FT_Bool FVar2;
  int iVar3;
  PSH_Hint_conflict hint_00;
  FT_Int *pFVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  FT_Pos *pFVar14;
  ulong uVar15;
  FT_Pos FVar16;
  ulong uVar17;
  int iVar18;
  FT_Pos FVar19;
  int iVar20;
  FT_UInt FVar21;
  long lVar22;
  FT_Int *pFVar23;
  bool bVar24;
  bool bVar25;
  int local_54;
  
  FVar21 = hint->flags;
  if ((FVar21 & 8) != 0) {
    return;
  }
  lVar22 = (long)(int)globals->dimension[(uint)dimension].scale_mult;
  iVar20 = hint->org_pos;
  lVar5 = lVar22 * iVar20;
  uVar6 = (long)(int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10) +
          globals->dimension[(uint)dimension].scale_delta;
  iVar12 = hint->org_len;
  uVar10 = iVar12 * lVar22 + 0x8000 + (iVar12 * lVar22 >> 0x3f);
  iVar9 = (int)(uVar10 >> 0x10);
  uVar17 = (ulong)iVar9;
  if (dimension == 1) {
    if (glyph->do_vert_hints == '\0') {
LAB_001fb9ef:
      hint->cur_pos = uVar6;
      hint->cur_len = uVar17;
      goto LAB_001fbc9f;
    }
    FVar1 = glyph->do_vert_snapping;
    bVar25 = FVar1 != '\0';
    hint->cur_len = uVar17;
    FVar2 = (globals->blues).no_overshoots;
    FVar21 = (globals->blues).normal_top.count;
    pFVar14 = &(globals->blues).normal_top.zones[0].cur_ref;
    local_54 = 2;
    while (bVar24 = FVar21 != 0, FVar21 = FVar21 - 1, bVar24) {
      lVar5 = (long)(iVar12 + iVar20) - (long)*(FT_Int *)((long)pFVar14 + -4);
      iVar13 = (globals->blues).blue_fuzz;
      if (SBORROW8(lVar5,-(long)iVar13) != lVar5 + iVar13 < 0) break;
      if (iVar12 + iVar20 <= iVar13 + *(int *)(pFVar14 + -1)) {
        if ((FVar2 != '\0') || (lVar5 <= (globals->blues).blue_threshold)) {
          FVar19 = *pFVar14;
          local_54 = 3;
          iVar13 = 1;
          goto LAB_001fbad5;
        }
        break;
      }
      pFVar14 = pFVar14 + 6;
    }
    FVar19 = 0;
    iVar13 = 0;
LAB_001fbad5:
    uVar7 = (globals->blues).normal_bottom.count;
    iVar18 = uVar7 + 1;
    FVar16 = 0;
    pFVar4 = &(globals->blues).normal_bottom.zones[(ulong)uVar7 - 1].org_top;
    do {
      pFVar23 = pFVar4;
      iVar18 = iVar18 + -1;
      if (iVar18 == 0) goto LAB_001fbb6d;
      lVar5 = (long)*pFVar23 - (long)iVar20;
      iVar3 = (globals->blues).blue_fuzz;
      if (SBORROW8(lVar5,-(long)iVar3) != lVar5 + iVar3 < 0) goto LAB_001fbb6d;
      pFVar4 = pFVar23 + -0xc;
    } while (iVar20 < pFVar23[1] - iVar3);
    if ((FVar2 == '\0') && ((globals->blues).blue_threshold <= lVar5)) {
      FVar16 = 0;
    }
    else {
      FVar16 = *(FT_Pos *)(pFVar23 + 2);
      iVar13 = local_54;
    }
LAB_001fbb6d:
    if (iVar13 == 1) {
      hint->cur_pos = FVar19 - uVar17;
      if (FVar1 != '\0') {
        uVar6 = 0x40;
        if (0x3f < (long)uVar17) {
          uVar6 = uVar17 + 0x20 & 0x7fffffffffffffc0;
        }
        hint->cur_pos = FVar19 - uVar6;
        goto LAB_001fbc97;
      }
    }
    else if (iVar13 == 3) {
      hint->cur_pos = FVar16;
      hint->cur_len = FVar19 - FVar16;
    }
    else {
      if (iVar13 != 2) goto LAB_001fb91b;
      hint->cur_pos = FVar16;
      if (FVar1 != '\0') {
        uVar6 = 0x40;
        if (0x3f < (long)uVar17) {
          uVar6 = uVar17 + 0x20 & 0x7fffffffffffffc0;
        }
        goto LAB_001fbc97;
      }
    }
  }
  else {
    if (dimension == 0) {
      if (glyph->do_horz_hints == '\0') goto LAB_001fb9ef;
      bVar25 = glyph->do_horz_snapping != '\0';
    }
    else {
      bVar25 = false;
    }
    hint->cur_len = uVar17;
LAB_001fb91b:
    hint_00 = hint->parent;
    if (hint_00 != (PSH_Hint_conflict)0x0) {
      if ((hint_00->flags & 8) == 0) {
        psh_hint_align(hint_00,globals,dimension,glyph);
        iVar20 = hint->org_pos;
        iVar12 = hint->org_len;
      }
      lVar22 = lVar22 * ((iVar20 - ((hint_00->org_len >> 1) + hint_00->org_pos)) + (iVar12 >> 1));
      uVar6 = (hint_00->cur_pos - ((long)((uVar10 >> 0x10) << 0x20) >> 0x21)) +
              (hint_00->cur_len >> 1) +
              (long)(int)((ulong)((lVar22 >> 0x3f) + lVar22 + 0x8000) >> 0x10);
    }
    uVar10 = uVar6;
    if (glyph->do_stem_adjust != '\0') {
      if (iVar9 < 0x41) {
        if (iVar9 < 0x20) {
          uVar8 = uVar6 + 0x20 & 0xffffffffffffffc0;
          uVar10 = uVar8;
          if (0 < iVar9) {
            uVar11 = uVar8 - uVar6;
            uVar10 = uVar6 + uVar17 + 0x20 & 0xffffffffffffffc0;
            uVar15 = uVar10 - (uVar6 + uVar17);
            uVar6 = -uVar11;
            if (0 < (long)uVar11) {
              uVar6 = uVar11;
            }
            uVar11 = -uVar15;
            if (0 < (long)uVar15) {
              uVar11 = uVar15;
            }
            if (uVar6 <= uVar11) {
              uVar10 = uVar8;
            }
          }
        }
        else {
          uVar10 = uVar6 + (uVar17 >> 1) & 0xffffffffffffffc0;
          uVar17 = 0x40;
        }
      }
      else {
        uVar6 = globals->dimension[(uint)dimension].stdw.widths[0].cur;
        uVar11 = uVar17 - uVar6;
        uVar8 = -uVar11;
        if (0 < (long)uVar11) {
          uVar8 = uVar11;
        }
        uVar11 = 0x30;
        if (0x30 < (long)uVar6) {
          uVar11 = uVar6;
        }
        if (uVar8 < 0x28) {
          uVar17 = uVar11;
        }
        if ((long)uVar17 < 0xc0) {
          uVar7 = (uint)uVar17 & 0x3f;
          if (9 < uVar7) {
            if (uVar7 < 0x20) {
              uVar17 = uVar17 & 0x7fffffffffffffc0 | 10;
            }
            else if (uVar7 < 0x36) {
              uVar17 = uVar17 & 0x7fffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          uVar17 = uVar17 + 0x20 & 0x7fffffffffffffc0;
        }
      }
    }
    uVar11 = (uVar10 + 0x20 & 0xffffffffffffffc0) - uVar10;
    uVar6 = ((uVar10 + 0x20 + uVar17 & 0xffffffffffffffc0) - uVar10) - uVar17;
    uVar8 = -uVar11;
    if (0 < (long)uVar11) {
      uVar8 = uVar11;
    }
    uVar15 = -uVar6;
    if (0 < (long)uVar6) {
      uVar15 = uVar6;
    }
    if (uVar8 <= uVar15) {
      uVar6 = uVar11;
    }
    lVar5 = uVar6 + uVar10;
    hint->cur_pos = lVar5;
    hint->cur_len = uVar17;
    if (bVar25) {
      uVar6 = 0x40;
      if (0x3f < (long)uVar17) {
        uVar6 = uVar17 + 0x20 & 0x7fffffffffffffc0;
      }
      uVar17 = uVar6 >> 1;
      if ((uVar6 & 0x40) == 0) {
        uVar10 = lVar5 + uVar17 + 0x20 & 0xffffffffffffffc0;
      }
      else {
        uVar10 = lVar5 + uVar17 & 0xffffffffffffffc0 | 0x20;
      }
      hint->cur_pos = uVar10 - uVar17;
LAB_001fbc97:
      hint->cur_len = uVar6;
    }
  }
  FVar21 = hint->flags;
LAB_001fbc9f:
  hint->flags = FVar21 | 8;
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             ADD_INT( hint->org_pos, hint->org_len ),
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }